

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

CSHA256 * __thiscall CSHA256::Write(CSHA256 *this,uchar *data,size_t len)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  long in_RDX;
  void *in_RSI;
  CSHA256 *in_RDI;
  long in_FS_OFFSET;
  size_t blocks;
  size_t bufsize;
  uchar *end;
  ulong local_30;
  void *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = (void *)((long)in_RSI + in_RDX);
  local_30 = in_RDI->bytes & 0x3f;
  local_18 = in_RSI;
  if ((local_30 != 0) && (0x3f < local_30 + in_RDX)) {
    memcpy(in_RDI->buf + local_30,in_RSI,0x40 - local_30);
    in_RDI->bytes = (0x40 - local_30) + in_RDI->bytes;
    local_18 = (void *)((0x40 - local_30) + (long)in_RSI);
    (*(code *)(anonymous_namespace)::Transform)(in_RDI,in_RDI->buf,1);
    local_30 = 0;
  }
  if (0x3f < (long)pvVar3 - (long)local_18) {
    lVar2 = ((long)pvVar3 - (long)local_18) / 0x40;
    (*(code *)(anonymous_namespace)::Transform)(in_RDI,local_18,lVar2);
    local_18 = (void *)(lVar2 * 0x40 + (long)local_18);
    in_RDI->bytes = lVar2 * 0x40 + in_RDI->bytes;
  }
  if (local_18 < pvVar3) {
    memcpy(in_RDI->buf + local_30,local_18,(long)pvVar3 - (long)local_18);
    in_RDI->bytes = (long)pvVar3 + (in_RDI->bytes - (long)local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CSHA256& CSHA256::Write(const unsigned char* data, size_t len)
{
    const unsigned char* end = data + len;
    size_t bufsize = bytes % 64;
    if (bufsize && bufsize + len >= 64) {
        // Fill the buffer, and process it.
        memcpy(buf + bufsize, data, 64 - bufsize);
        bytes += 64 - bufsize;
        data += 64 - bufsize;
        Transform(s, buf, 1);
        bufsize = 0;
    }
    if (end - data >= 64) {
        size_t blocks = (end - data) / 64;
        Transform(s, data, blocks);
        data += 64 * blocks;
        bytes += 64 * blocks;
    }
    if (end > data) {
        // Fill the buffer with what remains.
        memcpy(buf + bufsize, data, end - data);
        bytes += end - data;
    }
    return *this;
}